

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

QByteArray * qCleanupFuncinfo(QByteArray *__return_storage_ptr__,QByteArray info)

{
  char cVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  ulong extraout_RDX;
  ulong __length;
  char *pcVar11;
  QArrayDataPointer<char> *in_RSI;
  char *pcVar12;
  long in_FS_OFFSET;
  QByteArrayView before;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  QByteArrayView after;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RSI->size;
  if (lVar5 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001ff500;
  }
  else {
    pcVar8 = in_RSI->ptr;
    if (((pcVar8[lVar5 + -1] == ']') && (*pcVar8 != '+')) && (*pcVar8 != '-')) {
      pcVar12 = (char *)(lVar5 + -1);
      do {
        if (pcVar12 == (char *)0x1) goto LAB_001ff0e0;
        pcVar11 = pcVar12 + -1;
        pcVar9 = pcVar8 + -1 + (long)pcVar12;
        pcVar12 = pcVar11;
      } while (*pcVar9 != '[');
      QByteArray::truncate((QByteArray *)in_RSI,pcVar11,(__off_t)pcVar11);
      lVar5 = in_RSI->size;
LAB_001ff0e0:
      if ((lVar5 != 0) && (in_RSI->ptr[lVar5 + -1] == ' ')) {
        QByteArray::chop((QByteArray *)in_RSI,1);
      }
    }
    qVar6 = QByteArrayView::lengthHelperCharArray("operator ",10);
    qVar7 = QByteArrayView::lengthHelperCharArray("operator",9);
    before.m_data = "operator ";
    before.m_size = qVar6;
    after.m_data = "operator";
    after.m_size = qVar7;
    QByteArray::replace((QByteArray *)in_RSI,before,after);
    pcVar8 = (char *)0xffffffffffffffff;
    while (pcVar8 = (char *)QByteArray::lastIndexOf((QByteArray *)in_RSI,')',(qsizetype)pcVar8),
          pcVar8 != (char *)0xffffffffffffffff) {
      qVar6 = QByteArray::indexOf((QByteArray *)in_RSI,'>',(qsizetype)pcVar8);
      if ((qVar6 == -1) &&
         (qVar6 = QByteArray::indexOf((QByteArray *)in_RSI,':',(qsizetype)pcVar8), qVar6 == -1)) {
        __length = extraout_RDX;
        for (iVar4 = 1; (pcVar8 != (char *)0x1 && (iVar4 != 0)); iVar4 = iVar4 + (int)__length) {
          __length = (ulong)-(uint)((in_RSI->ptr + -1)[(long)pcVar8] == '(');
          if ((in_RSI->ptr + -1)[(long)pcVar8] == ')') {
            __length = 1;
          }
          pcVar8 = pcVar8 + -1;
        }
        if (iVar4 != 0) break;
        QByteArray::truncate((QByteArray *)in_RSI,pcVar8,__length);
        if ((in_RSI->ptr + -1)[(long)pcVar8] != ')') {
LAB_001ff25c:
          pcVar12 = pcVar8 + -1;
          if ((long)pcVar8 < 1) goto LAB_001ff32e;
          cVar1 = (in_RSI->ptr + -1)[(long)pcVar8];
          if (cVar1 == ')') {
            pcVar11 = "operator()";
LAB_001ff304:
            qVar6 = QByteArrayView::lengthHelperCharArray(pcVar11,0xb);
            bv_02.m_data = pcVar11;
            bv_02.m_size = qVar6;
            qVar6 = QByteArray::indexOf((QByteArray *)in_RSI,bv_02,0);
            pcVar9 = (char *)(qVar6 + 10);
            pcVar11 = pcVar8 + -3;
LAB_001ff327:
            if (pcVar9 == pcVar8) {
              pcVar12 = pcVar11;
            }
          }
          else {
            if (cVar1 == '<') {
              pcVar11 = "operator<";
LAB_001ff29b:
              qVar6 = QByteArrayView::lengthHelperCharArray(pcVar11,10);
              bv_00.m_data = pcVar11;
              bv_00.m_size = qVar6;
              qVar6 = QByteArray::indexOf((QByteArray *)in_RSI,bv_00,0);
              pcVar9 = (char *)(qVar6 + 9);
              pcVar11 = pcVar8 + -2;
              goto LAB_001ff327;
            }
            if (cVar1 == '=') {
              qVar6 = QByteArrayView::lengthHelperCharArray("operator<=",0xb);
              bv_01.m_data = "operator<=";
              bv_01.m_size = qVar6;
              qVar6 = QByteArray::indexOf((QByteArray *)in_RSI,bv_01,0);
              if ((char *)(qVar6 + 10) != pcVar8) {
                pcVar11 = "operator>=";
                goto LAB_001ff304;
              }
              pcVar12 = pcVar8 + -3;
            }
            else if (cVar1 == '>') {
              pcVar11 = "operator>";
              goto LAB_001ff29b;
            }
          }
LAB_001ff32e:
          pcVar8 = (char *)0xffffffffffffffff;
          if ((long)pcVar12 < -1) {
            pcVar8 = pcVar12;
          }
          iVar4 = 0;
          iVar10 = 0;
          goto LAB_001ff33d;
        }
        qVar6 = QByteArrayView::lengthHelperCharArray("operator()",0xb);
        bv.m_data = "operator()";
        bv.m_size = qVar6;
        qVar6 = QByteArray::indexOf((QByteArray *)in_RSI,bv,0);
        if ((char *)(qVar6 + 10) == pcVar8) goto LAB_001ff25c;
        QByteArray::indexOf((QByteArray *)in_RSI,'(',0);
        QByteArray::remove((QByteArray *)in_RSI,(char *)0x0);
        QByteArray::chop((QByteArray *)in_RSI,1);
      }
      else {
        pcVar8 = pcVar8 + -1;
      }
    }
LAB_001ff39c:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001ff500;
  }
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,in_RSI);
  return __return_storage_ptr__;
LAB_001ff33d:
  pcVar11 = pcVar8;
  if ((long)pcVar12 < 0) goto LAB_001ff3d5;
  if ((iVar10 < 0) || (iVar4 < 0)) goto LAB_001ff39c;
  cVar1 = in_RSI->ptr[(long)pcVar12];
  if (cVar1 == '(') {
    iVar10 = iVar10 + -1;
  }
  else if (cVar1 == '>') {
    iVar4 = iVar4 + 1;
  }
  else if (cVar1 == '<') {
    iVar4 = iVar4 + -1;
  }
  else if (cVar1 == ')') {
    iVar10 = iVar10 + 1;
  }
  else {
    pcVar11 = pcVar12;
    if ((iVar4 == 0 && cVar1 == ' ') && iVar10 == 0) goto LAB_001ff3d5;
  }
  pcVar12 = pcVar12 + -1;
  goto LAB_001ff33d;
LAB_001ff3d5:
  QByteArray::mid((QByteArray *)&local_58,(QByteArray *)in_RSI,(qsizetype)(pcVar11 + 1),-1);
  pDVar2 = in_RSI->d;
  pcVar8 = in_RSI->ptr;
  in_RSI->d = local_58.d;
  in_RSI->ptr = local_58.ptr;
  qVar6 = in_RSI->size;
  in_RSI->size = local_58.size;
  local_58.d = pDVar2;
  local_58.ptr = pcVar8;
  local_58.size = qVar6;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  while ((*in_RSI->ptr == '&' || (*in_RSI->ptr == '*'))) {
    QByteArray::mid((QByteArray *)&local_58,(QByteArray *)in_RSI,1,-1);
    pDVar2 = in_RSI->d;
    pcVar8 = in_RSI->ptr;
    in_RSI->d = local_58.d;
    in_RSI->ptr = local_58.ptr;
    qVar6 = in_RSI->size;
    in_RSI->size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar8;
    local_58.size = qVar6;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  while ((pcVar8 = (char *)QByteArray::lastIndexOf((QByteArray *)in_RSI,'>',-1),
         pcVar8 != (char *)0xffffffffffffffff &&
         (bVar3 = QByteArray::contains((QByteArray *)in_RSI,'<'), bVar3))) {
    iVar4 = 1;
    while ((pcVar8 != (char *)0x1 && (iVar4 != 0))) {
      pcVar12 = in_RSI->ptr + -1 + (long)pcVar8;
      pcVar8 = pcVar8 + -1;
      if (*pcVar12 == '<') {
        iVar4 = iVar4 + -1;
      }
      else if (*pcVar12 == '>') {
        iVar4 = iVar4 + 1;
      }
    }
    QByteArray::remove((QByteArray *)in_RSI,pcVar8);
  }
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_001ff500:
  __stack_chk_fail();
}

Assistant:

Q_AUTOTEST_EXPORT QByteArray qCleanupFuncinfo(QByteArray info)
{
    // Strip the function info down to the base function name
    // note that this throws away the template definitions,
    // the parameter types (overloads) and any const/volatile qualifiers.

    if (info.isEmpty())
        return info;

    qsizetype pos;

    // Skip trailing [with XXX] for templates (gcc), but make
    // sure to not affect Objective-C message names.
    pos = info.size() - 1;
    if (info.endsWith(']') && !(info.startsWith('+') || info.startsWith('-'))) {
        while (--pos) {
          if (info.at(pos) == '[') {
              info.truncate(pos);
              break;
          }
        }
        if (info.endsWith(' ')) {
          info.chop(1);
        }
    }

    // operator names with '(', ')', '<', '>' in it
    static const char operator_call[] = "operator()";
    static const char operator_lessThan[] = "operator<";
    static const char operator_greaterThan[] = "operator>";
    static const char operator_lessThanEqual[] = "operator<=";
    static const char operator_greaterThanEqual[] = "operator>=";

    // canonize operator names
    info.replace("operator ", "operator");

    pos = -1;
    // remove argument list
    forever {
        int parencount = 0;
        pos = info.lastIndexOf(')', pos);
        if (pos == -1) {
            // Don't know how to parse this function name
            return info;
        }
        if (info.indexOf('>', pos) != -1
                || info.indexOf(':', pos) != -1) {
            // that wasn't the function argument list.
            --pos;
            continue;
        }

        // find the beginning of the argument list
        --pos;
        ++parencount;
        while (pos && parencount) {
            if (info.at(pos) == ')')
                ++parencount;
            else if (info.at(pos) == '(')
                --parencount;
            --pos;
        }
        if (parencount != 0)
            return info;

        info.truncate(++pos);

        if (info.at(pos - 1) == ')') {
            if (info.indexOf(operator_call) == pos - qsizetype(strlen(operator_call)))
                break;

            // this function returns a pointer to a function
            // and we matched the arguments of the return type's parameter list
            // try again
            info.remove(0, info.indexOf('('));
            info.chop(1);
            continue;
        } else {
            break;
        }
    }